

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O0

void msr_get_context(raplcap_msr_ctx *ctx,uint32_t cpu_model,uint64_t units_msrval)

{
  double dVar1;
  uint64_t units_msrval_local;
  uint32_t cpu_model_local;
  raplcap_msr_ctx *ctx_local;
  
  if (ctx == (raplcap_msr_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0x149,"void msr_get_context(raplcap_msr_ctx *, uint32_t, uint64_t)");
  }
  if (cpu_model != 0) {
    ctx->cpu_model = cpu_model;
    switch(cpu_model) {
    case 0x2a:
    case 0x2d:
    case 0x3a:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x4e:
    case 0x5c:
    case 0x5e:
    case 0x5f:
    case 0x66:
    case 0x7a:
    case 0x7d:
    case 0x7e:
    case 0x86:
    case 0x8e:
    case 0x96:
    case 0x9c:
    case 0x9e:
    case 0xa5:
    case 0xa6:
    case 0xad:
    case 0xae:
    case 0xaf:
      dVar1 = from_msr_pu_default(units_msrval);
      ctx->power_units = dVar1;
      dVar1 = from_msr_eu_default(units_msrval);
      ctx->energy_units = dVar1;
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      dVar1 = from_msr_tu_default(units_msrval);
      ctx->time_units = dVar1;
      ctx->cfg = CFG_DEFAULT;
      break;
    default:
      fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
      fprintf(_stderr,"Unknown architecture\n");
      fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
      fprintf(_stderr,"Please report a bug if you see this message, it should never occur!\n");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                    ,0x1d3,"void msr_get_context(raplcap_msr_ctx *, uint32_t, uint64_t)");
    case 0x37:
    case 0x4a:
    case 0x5a:
    case 0x5d:
      dVar1 = from_msr_pu_atom(units_msrval);
      ctx->power_units = dVar1;
      dVar1 = from_msr_eu_atom(units_msrval);
      ctx->energy_units = dVar1;
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      dVar1 = from_msr_tu_default(units_msrval);
      ctx->time_units = dVar1;
      ctx->cfg = CFG_ATOM;
      break;
    case 0x3f:
    case 0x4f:
    case 0x55:
    case 0x56:
    case 0x57:
    case 0x6a:
    case 0x6c:
    case 0x85:
      dVar1 = from_msr_pu_default(units_msrval);
      ctx->power_units = dVar1;
      dVar1 = from_msr_eu_default(units_msrval);
      ctx->energy_units = dVar1;
      ctx->energy_units_dram = 1.53e-05;
      ctx->energy_units_psys = ctx->energy_units;
      dVar1 = from_msr_tu_default(units_msrval);
      ctx->time_units = dVar1;
      ctx->cfg = CFG_DEFAULT;
      break;
    case 0x4c:
      dVar1 = from_msr_pu_atom(units_msrval);
      ctx->power_units = dVar1;
      dVar1 = from_msr_eu_default(units_msrval);
      ctx->energy_units = dVar1;
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      dVar1 = from_msr_tu_default(units_msrval);
      ctx->time_units = dVar1;
      ctx->cfg = CFG_ATOM_AIRMONT;
      break;
    case 0x4d:
      dVar1 = from_msr_pu_atom(units_msrval);
      ctx->power_units = dVar1;
      dVar1 = from_msr_eu_default(units_msrval);
      ctx->energy_units = dVar1;
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      dVar1 = from_msr_tu_default(units_msrval);
      ctx->time_units = dVar1;
      ctx->cfg = CFG_DEFAULT;
      break;
    case 0x8c:
    case 0x8d:
    case 0x97:
    case 0x9a:
    case 0xb7:
    case 0xba:
    case 0xbf:
      dVar1 = from_msr_pu_default(units_msrval);
      ctx->power_units = dVar1;
      dVar1 = from_msr_eu_default(units_msrval);
      ctx->energy_units = dVar1;
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      dVar1 = from_msr_tu_default(units_msrval);
      ctx->time_units = dVar1;
      ctx->cfg = CFG_DEFAULT_PL4;
      break;
    case 0x8f:
    case 0xcf:
      dVar1 = from_msr_pu_default(units_msrval);
      ctx->power_units = dVar1;
      dVar1 = from_msr_eu_default(units_msrval);
      ctx->energy_units = dVar1;
      ctx->energy_units_dram = 6.1e-05;
      ctx->energy_units_psys = 1.0;
      dVar1 = from_msr_tu_default(units_msrval);
      ctx->time_units = dVar1;
      ctx->cfg = CFG_SPR;
      break;
    case 0xaa:
    case 0xbd:
      dVar1 = from_msr_pu_default(units_msrval);
      ctx->power_units = dVar1;
      dVar1 = from_msr_eu_default(units_msrval);
      ctx->energy_units = dVar1;
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      dVar1 = from_msr_tu_default(units_msrval);
      ctx->time_units = dVar1;
      ctx->cfg = CFG_METEORLAKE;
    }
    return;
  }
  __assert_fail("cpu_model > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                ,0x14a,"void msr_get_context(raplcap_msr_ctx *, uint32_t, uint64_t)");
}

Assistant:

void msr_get_context(raplcap_msr_ctx* ctx, uint32_t cpu_model, uint64_t units_msrval) {
  assert(ctx != NULL);
  assert(cpu_model > 0);
  ctx->cpu_model = cpu_model;
  switch (cpu_model) {
    case CPUID_MODEL_SANDYBRIDGE:
    case CPUID_MODEL_SANDYBRIDGE_X:
    //
    case CPUID_MODEL_IVYBRIDGE:
    case CPUID_MODEL_IVYBRIDGE_X:
    //
    case CPUID_MODEL_HASWELL:
    case CPUID_MODEL_HASWELL_L:
    case CPUID_MODEL_HASWELL_G:
    //
    case CPUID_MODEL_BROADWELL:
    case CPUID_MODEL_BROADWELL_G:
    //
    case CPUID_MODEL_SKYLAKE_L:
    case CPUID_MODEL_SKYLAKE:
    //
    case CPUID_MODEL_KABYLAKE_L:
    case CPUID_MODEL_KABYLAKE:
    //
    case CPUID_MODEL_CANNONLAKE_L:
    //
    case CPUID_MODEL_ICELAKE:
    case CPUID_MODEL_ICELAKE_L:
    //
    case CPUID_MODEL_COMETLAKE:
    case CPUID_MODEL_COMETLAKE_L:
    //
    case CPUID_MODEL_GRANITERAPIDS_X:
    case CPUID_MODEL_GRANITERAPIDS_D:
    //
    case CPUID_MODEL_ATOM_GOLDMONT:
    case CPUID_MODEL_ATOM_GOLDMONT_D:
    case CPUID_MODEL_ATOM_GOLDMONT_PLUS:
    case CPUID_MODEL_ATOM_TREMONT_D:
    case CPUID_MODEL_ATOM_TREMONT:
    case CPUID_MODEL_ATOM_TREMONT_L:
    //
    case CPUID_MODEL_ATOM_CRESTMONT_X:
      ctx->power_units = from_msr_pu_default(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_DEFAULT;
      break;
    //----
    case CPUID_MODEL_SAPPHIRERAPIDS_X:
    //
    case CPUID_MODEL_EMERALDRAPIDS_X:
      ctx->power_units = from_msr_pu_default(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = 0.000061;
      ctx->energy_units_psys = 1.0;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_SPR;
      break;
    //----
    case CPUID_MODEL_TIGERLAKE_L:
    case CPUID_MODEL_TIGERLAKE:
    //
    case CPUID_MODEL_ALDERLAKE:
    case CPUID_MODEL_ALDERLAKE_L:
    //
    case CPUID_MODEL_RAPTORLAKE:
    case CPUID_MODEL_RAPTORLAKE_P:
    case CPUID_MODEL_RAPTORLAKE_S:
      ctx->power_units = from_msr_pu_default(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_DEFAULT_PL4;
      break;
    //----
    case CPUID_MODEL_METEORLAKE_L:
    //
    case CPUID_MODEL_LUNARLAKE_M:
      ctx->power_units = from_msr_pu_default(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_METEORLAKE;
      break;
    //----
    case CPUID_MODEL_HASWELL_X:
    case CPUID_MODEL_BROADWELL_X:
    case CPUID_MODEL_BROADWELL_D:
    case CPUID_MODEL_SKYLAKE_X:
    case CPUID_MODEL_ICELAKE_X:
    case CPUID_MODEL_ICELAKE_D:
    case CPUID_MODEL_XEON_PHI_KNL:
    case CPUID_MODEL_XEON_PHI_KNM:
      ctx->power_units = from_msr_pu_default(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = 0.0000153;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_DEFAULT;
      break;
    //----
    case CPUID_MODEL_ATOM_SILVERMONT:
    case CPUID_MODEL_ATOM_SILVERMONT_MID:
    case CPUID_MODEL_ATOM_AIRMONT_MID:
    case CPUID_MODEL_ATOM_SOFIA:
      ctx->power_units = from_msr_pu_atom(units_msrval);
      ctx->energy_units = from_msr_eu_atom(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_ATOM;
      break;
    case CPUID_MODEL_ATOM_SILVERMONT_D:
      ctx->power_units = from_msr_pu_atom(units_msrval);
      // The Intel SDM claims we should use from_msr_eu_atom, but that appears to be incorrect
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_DEFAULT;
      break;
    //----
    case CPUID_MODEL_ATOM_AIRMONT:
      ctx->power_units = from_msr_pu_atom(units_msrval);
      ctx->energy_units = from_msr_eu_default(units_msrval);
      ctx->energy_units_dram = ctx->energy_units;
      ctx->energy_units_psys = ctx->energy_units;
      ctx->time_units = from_msr_tu_default(units_msrval);
      ctx->cfg = CFG_ATOM_AIRMONT;
      break;
    //----
    default:
      raplcap_log(ERROR, "Unknown architecture\n");
      raplcap_log(ERROR, "Please report a bug if you see this message, it should never occur!\n");
      assert(0);
      return;
  }
  raplcap_log(DEBUG, "msr_get_context: model=%02X, "
              "power_units=%.12f, energy_units=%.12f, energy_units_dram=%.12f, energy_units_psys=%.12f, "
              "time_units=%.12f\n",
              ctx->cpu_model, ctx->power_units, ctx->energy_units, ctx->energy_units_dram, ctx->energy_units_psys,
              ctx->time_units);
}